

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

char * anon_unknown.dwarf_14dc25::ReadString(string *s,char *ptr)

{
  allocator<char> *in_RSI;
  string *in_RDI;
  char *q;
  char *p;
  allocator<char> *__a;
  allocator<char> *__end;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  string local_40 [32];
  allocator<char> *local_20;
  string *local_8;
  
  for (local_20 = in_RSI; *local_20 != (allocator<char>)0x0; local_20 = local_20 + 1) {
  }
  __end = &local_41;
  __a = local_20;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)__end,__a);
  std::__cxx11::string::operator=(local_8,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return (char *)(local_20 + 1);
}

Assistant:

const char *ReadString(std::string &s, const char *ptr) {
  // Read untile NULL(\0).
  const char *p = ptr;
  const char *q = ptr;
  while ((*q) != 0)
    q++;

  s = std::string(p, q);

  return q + 1; // skip '\0'
}